

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O1

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  pointer pcVar6;
  size_t sVar7;
  size_t __n;
  pointer pcVar8;
  
  sVar1 = (a->piece_)._M_len;
  if ((sVar1 != 0) &&
     ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = (b->piece_)._M_len;
  if ((sVar2 != 0) &&
     ((ulong)((long)(b->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe3,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = (c->piece_)._M_len;
  if ((sVar3 != 0) &&
     ((ulong)((long)(c->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe4,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar4 = (d->piece_)._M_len;
  if ((sVar4 != 0) &&
     ((ulong)((long)(d->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xe5,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  uVar5 = dest->_M_string_length;
  std::__cxx11::string::_M_replace_aux
            ((ulong)dest,uVar5,0,(char)sVar3 + (char)sVar4 + (char)sVar2 + (char)sVar1);
  pcVar6 = (dest->_M_dataplus)._M_p;
  pcVar8 = pcVar6 + uVar5;
  sVar7 = (a->piece_)._M_len;
  if (sVar7 != 0) {
    memcpy(pcVar8,(a->piece_)._M_str,sVar7);
  }
  pcVar8 = pcVar8 + sVar7;
  sVar7 = (b->piece_)._M_len;
  if (sVar7 != 0) {
    memcpy(pcVar8,(b->piece_)._M_str,sVar7);
  }
  pcVar8 = pcVar8 + sVar7;
  sVar7 = (c->piece_)._M_len;
  if (sVar7 != 0) {
    memcpy(pcVar8,(c->piece_)._M_str,sVar7);
  }
  __n = (d->piece_)._M_len;
  if (__n != 0) {
    memcpy(pcVar8 + sVar7,(d->piece_)._M_str,__n);
  }
  if (pcVar8 + sVar7 + __n == pcVar6 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xef,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(
      dest, a.size() + b.size() + c.size() + d.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}